

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef Catch::Detail::anon_unknown_0::extractInstanceName(StringRef enumInstance)

{
  char cVar1;
  size_type start;
  StringRef *in_RDI;
  StringRef SVar2;
  size_t name_start;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  
  start = StringRef::size((StringRef *)&stack0xffffffffffffffe0);
  while( true ) {
    uVar3 = false;
    if (start != 0) {
      cVar1 = StringRef::operator[]((StringRef *)&stack0xffffffffffffffe0,start - 1);
      uVar3 = cVar1 != ':';
    }
    if ((bool)uVar3 == false) break;
    start = start - 1;
  }
  StringRef::size((StringRef *)&stack0xffffffffffffffe0);
  SVar2 = StringRef::substr(in_RDI,start,CONCAT17(uVar3,in_stack_ffffffffffffffd0));
  return SVar2;
}

Assistant:

StringRef extractInstanceName(StringRef enumInstance) {
                // Find last occurrence of ":"
                size_t name_start = enumInstance.size();
                while (name_start > 0 && enumInstance[name_start - 1] != ':') {
                    --name_start;
                }
                return enumInstance.substr(name_start, enumInstance.size() - name_start);
            }